

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O1

void AddOneKey(Keygroup *keygroup,PClassActor *mi,FScanner *sc)

{
  uint *puVar1;
  uint uVar2;
  OneKey *pOVar3;
  BYTE *pBVar4;
  char *pcVar5;
  PClassActor *pPVar6;
  char *message;
  
  if (mi == (PClassActor *)0x0) {
    pcVar5 = sc->String;
    message = "Unknown item \'%s\'";
LAB_005e4cc2:
    FScanner::ScriptError(sc,message,pcVar5);
    return;
  }
  pPVar6 = mi;
  if ((PClassActor *)AInventory::RegistrationInfo.MyClass != mi) {
    do {
      pPVar6 = (PClassActor *)(pPVar6->super_PClass).ParentClass;
      if (pPVar6 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
    } while (pPVar6 != (PClassActor *)0x0);
    if (pPVar6 == (PClassActor *)0x0) {
      pcVar5 = sc->String;
      message = "\'%s\' is not an inventory item";
      goto LAB_005e4cc2;
    }
  }
  TArray<OneKey,_OneKey>::Grow(&keygroup->anykeylist,1);
  pOVar3 = (keygroup->anykeylist).Array;
  uVar2 = (keygroup->anykeylist).Count;
  pOVar3[uVar2].key = mi;
  pOVar3[uVar2].count = 1;
  puVar1 = &(keygroup->anykeylist).Count;
  *puVar1 = *puVar1 + 1;
  pPVar6 = mi;
  if ((PClassActor *)AKey::RegistrationInfo.MyClass != mi) {
    do {
      pPVar6 = (PClassActor *)(pPVar6->super_PClass).ParentClass;
      if (pPVar6 == (PClassActor *)AKey::RegistrationInfo.MyClass) break;
    } while (pPVar6 != (PClassActor *)0x0);
    if (pPVar6 == (PClassActor *)0x0) {
      return;
    }
  }
  if ((ignorekey == '\0') && (pBVar4 = (mi->super_PClass).Defaults, pBVar4[0x4dc] == '\0')) {
    currentnumber = currentnumber + 1;
    pBVar4[0x4dc] = (BYTE)currentnumber;
  }
  return;
}

Assistant:

static void AddOneKey(Keygroup *keygroup, PClassActor *mi, FScanner &sc)
{
	if (mi)
	{
		// Any inventory item can be used to unlock a door
		if (mi->IsDescendantOf(RUNTIME_CLASS(AInventory)))
		{
			OneKey k = {mi,1};
			keygroup->anykeylist.Push (k);

			//... but only keys get key numbers!
			if (mi->IsDescendantOf(RUNTIME_CLASS(AKey)))
			{
				if (!ignorekey &&
					static_cast<AKey*>(GetDefaultByType(mi))->KeyNumber == 0)
				{
					static_cast<AKey*>(GetDefaultByType(mi))->KeyNumber=++currentnumber;
				}
			}
		}
		else
		{
			sc.ScriptError("'%s' is not an inventory item", sc.String);
		}
	}
	else
	{
		sc.ScriptError("Unknown item '%s'", sc.String);
	}
}